

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_promise_then_finally_func
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                  JSValue *func_data)

{
  int iVar1;
  code *func;
  JSValue JVar2;
  JSValue JVar3;
  JSValueUnion local_60;
  JSValueUnion local_58;
  int local_4c;
  JSValue *local_48;
  JSValueUnion local_40;
  undefined8 uStack_38;
  
  local_58 = local_60;
  JVar3 = *func_data;
  local_40.ptr = (void *)(local_40 << 0x20);
  uStack_38 = 3;
  iVar1 = 0;
  JVar2.tag = 3;
  JVar2.u.ptr = local_40.ptr;
  local_4c = magic;
  JVar2 = JS_CallInternal(ctx,func_data[1],(JSValue)(ZEXT816(3) << 0x40),JVar2,0,(JSValue *)0x0,2);
  if ((int)JVar2.tag != 6) {
    local_48 = argv;
    _local_40 = JVar2;
    JVar3 = js_promise_resolve(ctx,JVar3,iVar1,(JSValue *)&local_40,0);
    local_60.float64 = local_40.float64;
    if ((0xfffffff4 < local_40._8_4_) &&
       (iVar1 = *local_40.ptr, *(int *)local_40.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,_local_40);
    }
    JVar2 = JVar3;
    if ((uint)JVar3.tag != 6) {
      if (local_4c == 0) {
        func = js_promise_finally_value_thunk;
      }
      else {
        func = js_promise_finally_thrower;
      }
      _local_60 = JS_NewCFunctionData(ctx,func,0,0,1,local_48);
      if (local_60._8_4_ == 6) {
        JVar2 = _local_60;
        if ((0xfffffff4 < (uint)JVar3.tag) &&
           (iVar1 = *JVar3.u.ptr, *(int *)JVar3.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar3);
          JVar2 = _local_60;
        }
      }
      else {
        JVar2 = JS_InvokeFree(ctx,JVar3,0x7f,1,(JSValue *)&local_60);
        if ((0xfffffff4 < local_60._8_4_) &&
           (iVar1 = *local_60.ptr, *(int *)local_60.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,_local_60);
        }
      }
    }
  }
  return JVar2;
}

Assistant:

static JSValue js_promise_then_finally_func(JSContext *ctx, JSValueConst this_val,
                                            int argc, JSValueConst *argv,
                                            int magic, JSValue *func_data)
{
    JSValueConst ctor = func_data[0];
    JSValueConst onFinally = func_data[1];
    JSValue res, promise, ret, then_func;

    res = JS_Call(ctx, onFinally, JS_UNDEFINED, 0, NULL);
    if (JS_IsException(res))
        return res;
    promise = js_promise_resolve(ctx, ctor, 1, (JSValueConst *)&res, 0);
    JS_FreeValue(ctx, res);
    if (JS_IsException(promise))
        return promise;
    if (magic == 0) {
        then_func = JS_NewCFunctionData(ctx, js_promise_finally_value_thunk, 0,
                                        0, 1, argv);
    } else {
        then_func = JS_NewCFunctionData(ctx, js_promise_finally_thrower, 0,
                                        0, 1, argv);
    }
    if (JS_IsException(then_func)) {
        JS_FreeValue(ctx, promise);
        return then_func;
    }
    ret = JS_InvokeFree(ctx, promise, JS_ATOM_then, 1, (JSValueConst *)&then_func);
    JS_FreeValue(ctx, then_func);
    return ret;
}